

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_data_edge.h
# Opt level: O2

bool absl::lts_20240722::cord_internal::IsDataEdge(CordRep *edge)

{
  CordRepSubstring *pCVar1;
  bool bVar2;
  
  if (edge != (CordRep *)0x0) {
    bVar2 = true;
    if (edge->tag < 5) {
      if (edge->tag == 1) {
        pCVar1 = CordRep::substring(edge);
        bVar2 = 4 < pCVar1->child->tag;
      }
      else {
        bVar2 = false;
      }
    }
    return bVar2;
  }
  __assert_fail("edge != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_data_edge.h"
                ,0x21,"bool absl::cord_internal::IsDataEdge(const CordRep *)");
}

Assistant:

inline bool IsDataEdge(const CordRep* edge) {
  assert(edge != nullptr);

  // The fast path is that `edge` is an EXTERNAL or FLAT node, making the below
  // if a single, well predicted branch. We then repeat the FLAT or EXTERNAL
  // check in the slow path of the SUBSTRING check to optimize for the hot path.
  if (edge->tag == EXTERNAL || edge->tag >= FLAT) return true;
  if (edge->tag == SUBSTRING) edge = edge->substring()->child;
  return edge->tag == EXTERNAL || edge->tag >= FLAT;
}